

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::cmLocalGenerator
          (cmLocalGenerator *this,cmGlobalGenerator *gg,cmMakefile *makefile)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  cmMakefile *pcVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  long *plVar7;
  mapped_type *pmVar8;
  long lVar9;
  cmState *pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long *plVar12;
  _Base_ptr p_Var13;
  long lVar14;
  undefined8 __rhs;
  string replaceVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  undefined1 local_190 [8];
  undefined1 local_188 [8];
  undefined1 local_180 [48];
  pointer local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  _Base_ptr local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  cmCacheManager *local_a8;
  cmGlobVerificationManager *local_a0;
  undefined1 local_98 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_78;
  string local_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  cmMakefile::GetStateSnapshot(makefile);
  cmOutputConverter::cmOutputConverter(&this->super_cmOutputConverter,(cmStateSnapshot *)local_190);
  this->_vptr_cmLocalGenerator = (_func_int **)&PTR__cmLocalGenerator_005fb910;
  cmMakefile::GetStateSnapshot(makefile);
  cmMakefile::GetBacktrace(makefile);
  p_Var1 = &(this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->UniqueObjectNamesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ObjectMaxPathViolations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->GeneratorTargetSearchIndex)._M_h._M_buckets =
       &(this->GeneratorTargetSearchIndex)._M_h._M_single_bucket;
  (this->GeneratorTargetSearchIndex)._M_h._M_bucket_count = 1;
  (this->GeneratorTargetSearchIndex)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->GeneratorTargetSearchIndex)._M_h._M_element_count = 0;
  (this->GeneratorTargetSearchIndex)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->GeneratorTargetSearchIndex)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->GeneratorTargetSearchIndex)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->GeneratorTargets).
  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->GeneratorTargets).
  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->GeneratorTargets).
  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->WarnCMP0063)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ImportedGeneratorTargets)._M_h._M_buckets =
       &(this->ImportedGeneratorTargets)._M_h._M_single_bucket;
  (this->ImportedGeneratorTargets)._M_h._M_bucket_count = 1;
  (this->ImportedGeneratorTargets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ImportedGeneratorTargets)._M_h._M_element_count = 0;
  (this->ImportedGeneratorTargets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->AliasTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ImportedGeneratorTargets)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ImportedGeneratorTargets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->OwnedImportedGeneratorTargets).
  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OwnedImportedGeneratorTargets).
  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OwnedImportedGeneratorTargets).
  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78 = &this->Compilers;
  p_Var2 = &(this->Compilers)._M_t._M_impl.super__Rb_tree_header;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->Compilers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_180._32_8_ = &this->VariableMappings;
  p_Var2 = &(this->VariableMappings)._M_t._M_impl.super__Rb_tree_header;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header
  ;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->VariableMappings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0 = (cmGlobVerificationManager *)&this->CompilerSysroot;
  local_b8 = (_Base_ptr)&(this->CompilerSysroot).field_2;
  (this->CompilerSysroot)._M_dataplus._M_p = (pointer)local_b8;
  (this->CompilerSysroot)._M_string_length = 0;
  (this->CompilerSysroot).field_2._M_local_buf[0] = '\0';
  local_a8 = (cmCacheManager *)&this->LinkerSysroot;
  local_b0 = &(this->LinkerSysroot).field_2;
  (this->LinkerSysroot)._M_dataplus._M_p = (pointer)local_b0;
  (this->LinkerSysroot)._M_string_length = 0;
  (this->LinkerSysroot).field_2._M_local_buf[0] = '\0';
  this->GlobalGenerator = gg;
  this->Makefile = makefile;
  local_50 = &this->AliasTargets;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_190,&(makefile->AliasTargets)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->AliasTargets)._M_t);
  if ((_Base_ptr)local_180._0_8_ != (_Base_ptr)0x0) {
    (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_188._0_4_;
    (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)local_180._0_8_;
    (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_180._8_8_;
    (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)local_180._16_8_;
    *(_Rb_tree_header **)(local_180._0_8_ + 8) = p_Var1;
    (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = local_180._24_8_;
    local_180._0_8_ = (_Base_ptr)0x0;
    local_180._24_8_ = (_Base_ptr)0x0;
    local_180._8_8_ = (_Base_ptr)local_188;
    local_180._16_8_ = (_Base_ptr)local_188;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_190);
  this->EmitUniversalBinaryFlags = true;
  this->BackwardsCompatibility = 0;
  this->BackwardsCompatibilityFinal = false;
  ComputeObjectMaxPath(this);
  cmState::GetEnabledLanguages_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_48,this->GlobalGenerator->CMakeInstance->State);
  pcVar3 = this->Makefile;
  local_190 = (undefined1  [8])local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"CMAKE_SYSROOT_COMPILE","");
  pcVar6 = cmMakefile::GetDefinition(pcVar3,(string *)local_190);
  if (local_190 != (undefined1  [8])local_180) {
    operator_delete((void *)local_190,(ulong)(local_180._0_8_ + 1));
  }
  if (pcVar6 == (char *)0x0) {
    pcVar3 = this->Makefile;
    local_190 = (undefined1  [8])local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"CMAKE_SYSROOT","");
    cmMakefile::GetSafeDefinition(pcVar3,(string *)local_190);
    std::__cxx11::string::_M_assign((string *)local_a0);
    if (local_190 != (undefined1  [8])local_180) {
      operator_delete((void *)local_190,(ulong)(local_180._0_8_ + 1));
    }
  }
  else {
    pcVar4 = (char *)(this->CompilerSysroot)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)local_a0,0,pcVar4,(ulong)pcVar6);
  }
  pcVar3 = this->Makefile;
  local_190 = (undefined1  [8])local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"CMAKE_SYSROOT_LINK","");
  pcVar6 = cmMakefile::GetDefinition(pcVar3,(string *)local_190);
  if (local_190 != (undefined1  [8])local_180) {
    operator_delete((void *)local_190,(ulong)(local_180._0_8_ + 1));
  }
  if (pcVar6 == (char *)0x0) {
    pcVar3 = this->Makefile;
    local_190 = (undefined1  [8])local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"CMAKE_SYSROOT","");
    cmMakefile::GetSafeDefinition(pcVar3,(string *)local_190);
    std::__cxx11::string::_M_assign((string *)local_a8);
    if (local_190 != (undefined1  [8])local_180) {
      operator_delete((void *)local_190,(ulong)(local_180._0_8_ + 1));
    }
  }
  else {
    pcVar4 = (char *)(this->LinkerSysroot)._M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)local_a8,0,pcVar4,(ulong)pcVar6);
  }
  if (local_48._M_allocated_capacity != local_48._8_8_) {
    __rhs = local_48._M_allocated_capacity;
    do {
      iVar5 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar5 != 0) {
        std::operator+(&local_138,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_138);
        local_190 = (undefined1  [8])local_180;
        pcVar10 = (cmState *)(plVar7 + 2);
        if ((cmState *)*plVar7 == pcVar10) {
          local_180._0_8_ = *(undefined8 *)&(pcVar10->PropertyDefinitions)._M_t._M_impl;
          local_180._8_8_ = plVar7[3];
        }
        else {
          local_180._0_8_ = *(undefined8 *)&(pcVar10->PropertyDefinitions)._M_t._M_impl;
          local_190 = (undefined1  [8])*plVar7;
        }
        local_188 = (undefined1  [8])plVar7[1];
        *plVar7 = (long)pcVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_78,(key_type *)local_190);
        std::__cxx11::string::_M_assign((string *)pmVar8);
        if (local_190 != (undefined1  [8])local_180) {
          operator_delete((void *)local_190,(ulong)(local_180._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          (ulong)(local_138.field_2._M_allocated_capacity + 1));
        }
        pcVar3 = this->Makefile;
        std::operator+(&local_138,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_138);
        local_190 = (undefined1  [8])local_180;
        pcVar10 = (cmState *)(plVar7 + 2);
        if ((cmState *)*plVar7 == pcVar10) {
          local_180._0_8_ = *(undefined8 *)&(pcVar10->PropertyDefinitions)._M_t._M_impl;
          local_180._8_8_ = plVar7[3];
        }
        else {
          local_180._0_8_ = *(undefined8 *)&(pcVar10->PropertyDefinitions)._M_t._M_impl;
          local_190 = (undefined1  [8])*plVar7;
        }
        local_188 = (undefined1  [8])plVar7[1];
        *plVar7 = (long)pcVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        cmMakefile::GetSafeDefinition(pcVar3,(string *)local_190);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar7 = (long *)std::__cxx11::string::append((char *)local_118);
        local_180._40_8_ = &local_148;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 == paVar11) {
          local_148._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_148._8_8_ = plVar7[3];
        }
        else {
          local_148._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_180._40_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar7;
        }
        local_150 = (pointer)plVar7[1];
        *plVar7 = (long)paVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_180._32_8_,(key_type *)(local_180 + 0x28));
        std::__cxx11::string::_M_assign((string *)pmVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._40_8_ != &local_148) {
          operator_delete((void *)local_180._40_8_,(ulong)(local_148._M_allocated_capacity + 1));
        }
        if ((_Base_ptr)local_118._0_8_ != (_Base_ptr)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
        }
        if (local_190 != (undefined1  [8])local_180) {
          operator_delete((void *)local_190,(ulong)(local_180._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          (ulong)(local_138.field_2._M_allocated_capacity + 1));
        }
        std::operator+(&local_138,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_138);
        local_190 = (undefined1  [8])local_180;
        pcVar10 = (cmState *)(plVar7 + 2);
        if ((cmState *)*plVar7 == pcVar10) {
          local_180._0_8_ = *(undefined8 *)&(pcVar10->PropertyDefinitions)._M_t._M_impl;
          local_180._8_8_ = plVar7[3];
        }
        else {
          local_180._0_8_ = *(undefined8 *)&(pcVar10->PropertyDefinitions)._M_t._M_impl;
          local_190 = (undefined1  [8])*plVar7;
        }
        local_188 = (undefined1  [8])plVar7[1];
        *plVar7 = (long)pcVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          (ulong)(local_138.field_2._M_allocated_capacity + 1));
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_180 + 0x28),"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar7 = (long *)std::__cxx11::string::append((char *)(local_180 + 0x28));
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        plVar12 = plVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar12) {
          local_138.field_2._M_allocated_capacity = *plVar12;
          local_138.field_2._8_8_ = plVar7[3];
        }
        else {
          local_138.field_2._M_allocated_capacity = *plVar12;
          local_138._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_138._M_string_length = plVar7[1];
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._40_8_ != &local_148) {
          operator_delete((void *)local_180._40_8_,(ulong)(local_148._M_allocated_capacity + 1));
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar7 = (long *)std::__cxx11::string::append((char *)local_118);
        local_180._40_8_ = &local_148;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 == paVar11) {
          local_148._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_148._8_8_ = plVar7[3];
        }
        else {
          local_148._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_180._40_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar7;
        }
        local_150 = (pointer)plVar7[1];
        *plVar7 = (long)paVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((_Base_ptr)local_118._0_8_ != (_Base_ptr)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
        }
        std::operator+(&local_d8,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_118._0_8_ = local_118 + 0x10;
        p_Var13 = (_Base_ptr)(plVar7 + 2);
        if ((_Base_ptr)*plVar7 == p_Var13) {
          local_118._16_8_ = *(undefined8 *)p_Var13;
          local_118._24_8_ = plVar7[3];
        }
        else {
          local_118._16_8_ = *(undefined8 *)p_Var13;
          local_118._0_8_ = (_Base_ptr)*plVar7;
        }
        local_118._8_8_ = plVar7[1];
        *plVar7 = (long)p_Var13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,
                          (ulong)(local_d8.field_2._M_allocated_capacity + 1));
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar7 = (long *)std::__cxx11::string::append((char *)local_f8);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        plVar12 = plVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar12) {
          local_d8.field_2._M_allocated_capacity = *plVar12;
          local_d8.field_2._8_8_ = plVar7[3];
        }
        else {
          local_d8.field_2._M_allocated_capacity = *plVar12;
          local_d8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_d8._M_string_length = plVar7[1];
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((_Base_ptr)local_f8._0_8_ != (_Base_ptr)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar7 = (long *)std::__cxx11::string::append((char *)local_98);
        local_f8._0_8_ = local_f8 + 0x10;
        p_Var13 = (_Base_ptr)(plVar7 + 2);
        if ((_Base_ptr)*plVar7 == p_Var13) {
          local_f8._16_8_ = *(undefined8 *)p_Var13;
          local_f8._24_8_ = plVar7[3];
        }
        else {
          local_f8._16_8_ = *(undefined8 *)p_Var13;
          local_f8._0_8_ = (_Base_ptr)*plVar7;
        }
        local_f8._8_8_ = plVar7[1];
        *plVar7 = (long)p_Var13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
        }
        cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_190);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_180._32_8_,(key_type *)local_190);
        std::__cxx11::string::_M_assign((string *)pmVar8);
        cmMakefile::GetSafeDefinition(this->Makefile,&local_138);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_180._32_8_,&local_138);
        std::__cxx11::string::_M_assign((string *)pmVar8);
        cmMakefile::GetSafeDefinition(this->Makefile,(string *)(local_180 + 0x28));
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_180._32_8_,(key_type *)(local_180 + 0x28));
        std::__cxx11::string::_M_assign((string *)pmVar8);
        cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_118);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_180._32_8_,(key_type *)local_118);
        std::__cxx11::string::_M_assign((string *)pmVar8);
        cmMakefile::GetSafeDefinition(this->Makefile,&local_d8);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_180._32_8_,&local_d8);
        std::__cxx11::string::_M_assign((string *)pmVar8);
        cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_f8);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_180._32_8_,(key_type *)local_f8);
        std::__cxx11::string::_M_assign((string *)pmVar8);
        lVar14 = 0;
        do {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_98,*(char **)((long)&_ZGRL15ruleReplaceVars_ + lVar14),
                     (allocator<char> *)&local_70);
          lVar9 = std::__cxx11::string::find((char *)local_98,0x4b1cc7,0);
          if (lVar9 != -1) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"${LANG}","");
            cmsys::SystemTools::ReplaceString
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,&local_70,(string *)__rhs);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,
                              (ulong)(local_70.field_2._M_allocated_capacity + 1));
            }
          }
          cmMakefile::GetSafeDefinition
                    (this->Makefile,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_180._32_8_,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_98);
          std::__cxx11::string::_M_assign((string *)pmVar8);
          if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
          }
          lVar14 = lVar14 + 8;
        } while (lVar14 != 0x88);
        if ((_Base_ptr)local_f8._0_8_ != (_Base_ptr)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,
                          (ulong)(local_d8.field_2._M_allocated_capacity + 1));
        }
        if ((_Base_ptr)local_118._0_8_ != (_Base_ptr)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._40_8_ != &local_148) {
          operator_delete((void *)local_180._40_8_,(ulong)(local_148._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          (ulong)(local_138.field_2._M_allocated_capacity + 1));
        }
        if (local_190 != (undefined1  [8])local_180) {
          operator_delete((void *)local_190,(ulong)(local_180._0_8_ + 1));
        }
      }
      __rhs = __rhs + 0x20;
    } while (__rhs != local_48._8_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  return;
}

Assistant:

cmLocalGenerator::cmLocalGenerator(cmGlobalGenerator* gg, cmMakefile* makefile)
  : cmOutputConverter(makefile->GetStateSnapshot())
  , StateSnapshot(makefile->GetStateSnapshot())
  , DirectoryBacktrace(makefile->GetBacktrace())
{
  this->GlobalGenerator = gg;

  this->Makefile = makefile;

  this->AliasTargets = makefile->GetAliasTargets();

  this->EmitUniversalBinaryFlags = true;
  this->BackwardsCompatibility = 0;
  this->BackwardsCompatibilityFinal = false;

  this->ComputeObjectMaxPath();

  std::vector<std::string> enabledLanguages =
    this->GetState()->GetEnabledLanguages();

  if (const char* sysrootCompile =
        this->Makefile->GetDefinition("CMAKE_SYSROOT_COMPILE")) {
    this->CompilerSysroot = sysrootCompile;
  } else {
    this->CompilerSysroot = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
  }

  if (const char* sysrootLink =
        this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
    this->LinkerSysroot = sysrootLink;
  } else {
    this->LinkerSysroot = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
  }

  for (std::string const& lang : enabledLanguages) {
    if (lang == "NONE") {
      continue;
    }
    this->Compilers["CMAKE_" + lang + "_COMPILER"] = lang;

    this->VariableMappings["CMAKE_" + lang + "_COMPILER"] =
      this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER");

    std::string const& compilerArg1 = "CMAKE_" + lang + "_COMPILER_ARG1";
    std::string const& compilerTarget = "CMAKE_" + lang + "_COMPILER_TARGET";
    std::string const& compilerOptionTarget =
      "CMAKE_" + lang + "_COMPILE_OPTIONS_TARGET";
    std::string const& compilerExternalToolchain =
      "CMAKE_" + lang + "_COMPILER_EXTERNAL_TOOLCHAIN";
    std::string const& compilerOptionExternalToolchain =
      "CMAKE_" + lang + "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN";
    std::string const& compilerOptionSysroot =
      "CMAKE_" + lang + "_COMPILE_OPTIONS_SYSROOT";

    this->VariableMappings[compilerArg1] =
      this->Makefile->GetSafeDefinition(compilerArg1);
    this->VariableMappings[compilerTarget] =
      this->Makefile->GetSafeDefinition(compilerTarget);
    this->VariableMappings[compilerOptionTarget] =
      this->Makefile->GetSafeDefinition(compilerOptionTarget);
    this->VariableMappings[compilerExternalToolchain] =
      this->Makefile->GetSafeDefinition(compilerExternalToolchain);
    this->VariableMappings[compilerOptionExternalToolchain] =
      this->Makefile->GetSafeDefinition(compilerOptionExternalToolchain);
    this->VariableMappings[compilerOptionSysroot] =
      this->Makefile->GetSafeDefinition(compilerOptionSysroot);

    for (std::string replaceVar : ruleReplaceVars) {
      if (replaceVar.find("${LANG}") != std::string::npos) {
        cmSystemTools::ReplaceString(replaceVar, "${LANG}", lang);
      }

      this->VariableMappings[replaceVar] =
        this->Makefile->GetSafeDefinition(replaceVar);
    }
  }
}